

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txid.cpp
# Opt level: O3

void __thiscall Txid_TxidFromHex_Test::~Txid_TxidFromHex_Test(Txid_TxidFromHex_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Txid, TxidFromHex) {
  Txid txid = Txid(
      "1234567890123456789012345678901234567890123456789012345678901234");
  EXPECT_STREQ(
      txid.GetHex().c_str(),
      "1234567890123456789012345678901234567890123456789012345678901234");
  EXPECT_EQ(txid.GetData().GetDataSize(), 32);
  EXPECT_STREQ(
      txid.GetData().GetHex().c_str(),
      "3412907856341290785634129078563412907856341290785634129078563412");
}